

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtls.cpp
# Opt level: O1

Error * __thiscall
ot::commissioner::DtlsSession::Init
          (Error *__return_storage_ptr__,DtlsSession *this,DtlsConfig *aConfig)

{
  string *this_00;
  mbedtls_ssl_config *conf;
  vector<int,_std::allocator<int>_> *this_01;
  mbedtls_ssl_context *ssl;
  pointer piVar1;
  iterator iVar2;
  uchar *puVar3;
  uchar *puVar4;
  int iVar5;
  char *pcVar6;
  mbedtls_pk_context *pk;
  mbedtls_ssl_cookie_ctx *pmVar7;
  char *pcVar8;
  code *in_R9;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  undefined1 local_e8 [8];
  _Alloc_hider local_e0;
  size_type sStack_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d0;
  code *local_c0;
  mbedtls_ssl_cookie_ctx *local_b8;
  string local_b0;
  undefined1 local_90 [8];
  _Alloc_hider local_88;
  size_type sStack_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_68;
  size_type sStack_60;
  mbedtls_pk_context *local_50;
  mbedtls_x509_crt *local_48;
  mbedtls_x509_crt *local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  __return_storage_ptr__->mCode = kNone;
  this_00 = &__return_storage_ptr__->mMessage;
  local_38 = &(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p = (pointer)local_38;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  conf = &this->mConfig;
  iVar5 = mbedtls_ssl_config_defaults(conf,(uint)this->mIsServer,1,0);
  if (iVar5 != 0) {
    ErrorFromMbedtlsError((Error *)local_e8,iVar5);
    __return_storage_ptr__->mCode = local_e8._0_4_;
    std::__cxx11::string::operator=((string *)this_00,(string *)&local_e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_p != &local_d0) {
      operator_delete(local_e0._M_p);
    }
    if (iVar5 != 0) {
      return __return_storage_ptr__;
    }
  }
  mbedtls_ssl_conf_authmode(conf,2);
  mbedtls_debug_set_threshold(10);
  if (aConfig->mEnableDebugLogging == true) {
    mbedtls_ssl_conf_dbg(conf,HandleMbedtlsDebug,(void *)0x0);
  }
  mbedtls_ssl_conf_handshake_timeout(conf,8000,60000);
  piVar1 = (this->mCipherSuites).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->mCipherSuites).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish != piVar1) {
    (this->mCipherSuites).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = piVar1;
  }
  this_01 = &this->mCipherSuites;
  if ((aConfig->mPSK).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (aConfig->mPSK).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (&this->mPSK,&aConfig->mPSK);
    local_e8._0_4_ = 0xc0ff;
    iVar2._M_current =
         (this->mCipherSuites).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar2._M_current ==
        (this->mCipherSuites).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(this_01,iVar2,(int *)local_e8);
    }
    else {
      *iVar2._M_current = 0xc0ff;
      (this->mCipherSuites).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar2._M_current + 1;
    }
  }
  puVar3 = (aConfig->mCaChain).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  puVar4 = (aConfig->mCaChain).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_b8 = (mbedtls_ssl_cookie_ctx *)this_01;
  if (((puVar3 != puVar4) ||
      ((aConfig->mOwnCert).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
       .super__Vector_impl_data._M_start !=
       (aConfig->mOwnCert).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
       .super__Vector_impl_data._M_finish)) ||
     ((aConfig->mOwnKey).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (aConfig->mOwnKey).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish)) {
    local_40 = &this->mCaChain;
    iVar5 = mbedtls_x509_crt_parse(local_40,puVar3,(long)puVar4 - (long)puVar3);
    if (iVar5 != 0) {
      local_e8._0_4_ = string_type;
      local_e0._M_p = "bad CA certificate; {}";
      sStack_d8 = 0x16;
      local_d0._M_allocated_capacity = 0x100000000;
      local_c0 = ::fmt::v10::detail::
                 parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
      ;
      pcVar8 = "bad CA certificate; {}";
      local_d0._8_8_ =
           (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)local_e8;
      do {
        pcVar6 = pcVar8 + 1;
        if (*pcVar8 == '}') {
          if ((pcVar6 == "") || (*pcVar6 != '}')) {
            ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
          }
          pcVar6 = pcVar8 + 2;
        }
        else if (*pcVar8 == '{') {
          pcVar6 = ::fmt::v10::detail::
                   parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                             (pcVar8,"",
                              (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)local_e8);
        }
        pcVar8 = pcVar6;
      } while (pcVar6 != "");
      ErrorFromMbedtlsError((Error *)local_e8,iVar5);
      local_68 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_e0._M_p;
      sStack_60 = sStack_d8;
      fmt.size_ = 0xd;
      fmt.data_ = (char *)0x16;
      args.field_1 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
                      )(anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
                        )in_R9;
      args.desc_ = (unsigned_long_long)&local_68;
      ::fmt::v10::vformat_abi_cxx11_(&local_b0,(v10 *)"bad CA certificate; {}",fmt,args);
      local_90._0_4_ = kInvalidArgs;
      local_88._M_p = (pointer)&local_78;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_88,local_b0._M_dataplus._M_p,
                 local_b0._M_dataplus._M_p + local_b0._M_string_length);
      __return_storage_ptr__->mCode = local_90._0_4_;
      std::__cxx11::string::operator=((string *)this_00,(string *)&local_88);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_p != &local_78) {
        operator_delete(local_88._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_p != &local_d0) {
        operator_delete(local_e0._M_p);
      }
      if (iVar5 != 0) {
        return __return_storage_ptr__;
      }
    }
    local_48 = &this->mOwnCert;
    puVar3 = (aConfig->mOwnCert).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    iVar5 = mbedtls_x509_crt_parse
                      (local_48,puVar3,
                       (long)(aConfig->mOwnCert).
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_finish - (long)puVar3);
    if (iVar5 != 0) {
      local_e8._0_4_ = string_type;
      local_e0._M_p = "bad certificate; {}";
      sStack_d8 = 0x13;
      local_d0._M_allocated_capacity = 0x100000000;
      local_c0 = ::fmt::v10::detail::
                 parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
      ;
      pcVar8 = "bad certificate; {}";
      local_d0._8_8_ =
           (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)local_e8;
      do {
        pcVar6 = pcVar8 + 1;
        if (*pcVar8 == '}') {
          if ((pcVar6 == "") || (*pcVar6 != '}')) {
            ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
          }
          pcVar6 = pcVar8 + 2;
        }
        else if (*pcVar8 == '{') {
          pcVar6 = ::fmt::v10::detail::
                   parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                             (pcVar8,"",
                              (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)local_e8);
        }
        pcVar8 = pcVar6;
      } while (pcVar6 != "");
      ErrorFromMbedtlsError((Error *)local_e8,iVar5);
      local_68 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_e0._M_p;
      sStack_60 = sStack_d8;
      fmt_00.size_ = 0xd;
      fmt_00.data_ = (char *)0x13;
      args_00.field_1 =
           (anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
            )(anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
              )in_R9;
      args_00.desc_ = (unsigned_long_long)&local_68;
      ::fmt::v10::vformat_abi_cxx11_(&local_b0,(v10 *)"bad certificate; {}",fmt_00,args_00);
      local_90._0_4_ = kInvalidArgs;
      local_88._M_p = (pointer)&local_78;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_88,local_b0._M_dataplus._M_p,
                 local_b0._M_dataplus._M_p + local_b0._M_string_length);
      __return_storage_ptr__->mCode = local_90._0_4_;
      std::__cxx11::string::operator=((string *)this_00,(string *)&local_88);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_p != &local_78) {
        operator_delete(local_88._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_p != &local_d0) {
        operator_delete(local_e0._M_p);
      }
      if (iVar5 != 0) {
        return __return_storage_ptr__;
      }
    }
    pk = &this->mOwnKey;
    puVar3 = (aConfig->mOwnKey).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    in_R9 = mbedtls_ctr_drbg_random;
    iVar5 = mbedtls_pk_parse_key
                      (pk,puVar3,
                       (long)(aConfig->mOwnKey).
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_finish - (long)puVar3,(uchar *)0x0,0
                       ,mbedtls_ctr_drbg_random,&this->mCtrDrbg);
    if (iVar5 != 0) {
      local_e8._0_4_ = string_type;
      local_e0._M_p = "bad private key; {}";
      sStack_d8 = 0x13;
      local_d0._M_allocated_capacity = 0x100000000;
      local_c0 = ::fmt::v10::detail::
                 parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
      ;
      pcVar8 = "bad private key; {}";
      local_d0._8_8_ =
           (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)local_e8;
      local_50 = pk;
      do {
        pcVar6 = pcVar8 + 1;
        if (*pcVar8 == '}') {
          if ((pcVar6 == "") || (*pcVar6 != '}')) {
            ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
          }
          pcVar6 = pcVar8 + 2;
        }
        else if (*pcVar8 == '{') {
          pcVar6 = ::fmt::v10::detail::
                   parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                             (pcVar8,"",
                              (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)local_e8);
        }
        pcVar8 = pcVar6;
      } while (pcVar6 != "");
      ErrorFromMbedtlsError((Error *)local_e8,iVar5);
      local_68 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_e0._M_p;
      sStack_60 = sStack_d8;
      fmt_01.size_ = 0xd;
      fmt_01.data_ = (char *)0x13;
      args_01.field_1.values_ =
           (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)in_R9;
      args_01.desc_ = (unsigned_long_long)&local_68;
      ::fmt::v10::vformat_abi_cxx11_(&local_b0,(v10 *)"bad private key; {}",fmt_01,args_01);
      local_90._0_4_ = kInvalidArgs;
      local_88._M_p = (pointer)&local_78;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_88,local_b0._M_dataplus._M_p,
                 local_b0._M_dataplus._M_p + local_b0._M_string_length);
      __return_storage_ptr__->mCode = local_90._0_4_;
      std::__cxx11::string::operator=((string *)this_00,(string *)&local_88);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_p != &local_78) {
        operator_delete(local_88._M_p);
      }
      pk = local_50;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_p != &local_d0) {
        operator_delete(local_e0._M_p);
      }
      if (iVar5 != 0) {
        return __return_storage_ptr__;
      }
    }
    local_e8._0_4_ = 0xc0ae;
    iVar2._M_current =
         (this->mCipherSuites).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar2._M_current ==
        (this->mCipherSuites).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                ((vector<int,_std::allocator<int>_> *)local_b8,iVar2,(int *)local_e8);
    }
    else {
      *iVar2._M_current = 0xc0ae;
      (this->mCipherSuites).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar2._M_current + 1;
    }
    mbedtls_ssl_conf_ca_chain(conf,local_40,(mbedtls_x509_crl *)0x0);
    iVar5 = mbedtls_ssl_conf_own_cert(conf,local_48,pk);
    if (iVar5 != 0) {
      ErrorFromMbedtlsError((Error *)local_e8,iVar5);
      __return_storage_ptr__->mCode = local_e8._0_4_;
      std::__cxx11::string::operator=((string *)this_00,(string *)&local_e0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_p != &local_d0) {
        operator_delete(local_e0._M_p);
      }
      if (iVar5 != 0) {
        return __return_storage_ptr__;
      }
    }
  }
  pmVar7 = local_b8;
  local_e8._0_4_ = none_type;
  iVar2._M_current =
       (this->mCipherSuites).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (this->mCipherSuites).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              ((vector<int,_std::allocator<int>_> *)local_b8,iVar2,(int *)local_e8);
  }
  else {
    *iVar2._M_current = 0;
    (this->mCipherSuites).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  mbedtls_ssl_conf_ciphersuites
            (conf,(((_Vector_impl *)&(pmVar7->hmac_ctx).md_info)->super__Vector_impl_data)._M_start)
  ;
  ssl = &this->mSsl;
  mbedtls_ssl_set_export_keys_cb(ssl,HandleMbedtlsExportKeys,this);
  mbedtls_ssl_conf_rng(conf,mbedtls_ctr_drbg_random,&this->mCtrDrbg);
  if (this->mIsServer == true) {
    pmVar7 = &this->mCookie;
    iVar5 = mbedtls_ssl_cookie_setup(pmVar7,mbedtls_ctr_drbg_random,&this->mCtrDrbg);
    if (iVar5 != 0) {
      local_b8 = pmVar7;
      ErrorFromMbedtlsError((Error *)local_e8,iVar5);
      __return_storage_ptr__->mCode = local_e8._0_4_;
      std::__cxx11::string::operator=((string *)this_00,(string *)&local_e0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_p != &local_d0) {
        operator_delete(local_e0._M_p);
      }
      pmVar7 = local_b8;
      if (iVar5 != 0) {
        return __return_storage_ptr__;
      }
    }
    mbedtls_ssl_conf_dtls_cookies(conf,mbedtls_ssl_cookie_write,mbedtls_ssl_cookie_check,pmVar7);
  }
  mbedtls_ssl_set_bio(ssl,(this->mSocket).
                          super___shared_ptr<ot::commissioner::Socket,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr,Socket::Send,Socket::Receive,(mbedtls_ssl_recv_timeout_t *)0x0);
  mbedtls_ssl_set_timer_cb(ssl,&this->mHandshakeTimer,DtlsTimer::SetDelay,DtlsTimer::GetDelay);
  iVar5 = mbedtls_ssl_conf_max_frag_len(conf,'\x02');
  if (iVar5 != 0) {
    ErrorFromMbedtlsError((Error *)local_e8,iVar5);
    __return_storage_ptr__->mCode = local_e8._0_4_;
    std::__cxx11::string::operator=((string *)this_00,(string *)&local_e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_p != &local_d0) {
      operator_delete(local_e0._M_p);
    }
    if (iVar5 != 0) {
      return __return_storage_ptr__;
    }
  }
  mbedtls_ssl_set_mtu(ssl,0x500);
  iVar5 = mbedtls_ssl_setup(ssl,conf);
  if (iVar5 != 0) {
    ErrorFromMbedtlsError((Error *)local_e8,iVar5);
    __return_storage_ptr__->mCode = local_e8._0_4_;
    std::__cxx11::string::operator=((string *)this_00,(string *)&local_e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_p != &local_d0) {
      operator_delete(local_e0._M_p);
    }
    if (iVar5 != 0) {
      return __return_storage_ptr__;
    }
  }
  puVar3 = (aConfig->mPSK).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
           .super__Vector_impl_data._M_start;
  puVar4 = (aConfig->mPSK).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
           .super__Vector_impl_data._M_finish;
  if ((puVar3 != puVar4) &&
     (iVar5 = mbedtls_ssl_set_hs_ecjpake_password(ssl,puVar3,(long)puVar4 - (long)puVar3),
     iVar5 != 0)) {
    ::fmt::v10::detail::
    check_format_string<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_FMT_COMPILE_STRING,_0>
              ();
    ErrorFromMbedtlsError((Error *)local_90,iVar5);
    local_68 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_88._M_p;
    sStack_60 = sStack_80;
    fmt_02.size_ = 0xd;
    fmt_02.data_ = (char *)0x22;
    args_02.field_1 =
         (anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
          )(anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
            )in_R9;
    args_02.desc_ = (unsigned_long_long)&local_68;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_b0,(v10 *)"set DTLS pre-shared key failed; {}",fmt_02,args_02);
    local_e8._0_4_ = uint128_type;
    local_e0._M_p = (pointer)&local_d0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_e0,local_b0._M_dataplus._M_p,
               local_b0._M_dataplus._M_p + local_b0._M_string_length);
    __return_storage_ptr__->mCode = local_e8._0_4_;
    std::__cxx11::string::operator=((string *)this_00,(string *)&local_e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_p != &local_d0) {
      operator_delete(local_e0._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_p != &local_78) {
      operator_delete(local_88._M_p);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Error DtlsSession::Init(const DtlsConfig &aConfig)
{
    Error error;

    if (int fail = mbedtls_ssl_config_defaults(&mConfig, mIsServer, MBEDTLS_SSL_TRANSPORT_DATAGRAM,
                                               MBEDTLS_SSL_PRESET_DEFAULT))
    {
        ExitNow(error = ErrorFromMbedtlsError(fail));
    }

    mbedtls_ssl_conf_authmode(&mConfig, kAuthMode);

    // Debug
    mbedtls_debug_set_threshold(10);

    if (aConfig.mEnableDebugLogging)
    {
        mbedtls_ssl_conf_dbg(&mConfig, HandleMbedtlsDebug, nullptr);
    }

    // Timeouts
    mbedtls_ssl_conf_handshake_timeout(&mConfig, kDtlsHandshakeTimeoutMin * 1000, kDtlsHandshakeTimeoutMax * 1000);

    mCipherSuites.clear();

    // PSK
    if (!aConfig.mPSK.empty())
    {
        mPSK = aConfig.mPSK;
        mCipherSuites.push_back(MBEDTLS_TLS_ECJPAKE_WITH_AES_128_CCM_8);
    }

    // X509
    if (!aConfig.mCaChain.empty() || !aConfig.mOwnCert.empty() || !aConfig.mOwnKey.empty())
    {
        if (int fail = mbedtls_x509_crt_parse(&mCaChain, &aConfig.mCaChain[0], aConfig.mCaChain.size()))
        {
            ExitNow(error = ERROR_INVALID_ARGS("bad CA certificate; {}", ErrorFromMbedtlsError(fail).GetMessage()));
        }
        if (int fail = mbedtls_x509_crt_parse(&mOwnCert, &aConfig.mOwnCert[0], aConfig.mOwnCert.size()))
        {
            ExitNow(error = ERROR_INVALID_ARGS("bad certificate; {}", ErrorFromMbedtlsError(fail).GetMessage()));
        }
        if (int fail = mbedtls_pk_parse_key(&mOwnKey, &aConfig.mOwnKey[0], aConfig.mOwnKey.size(), nullptr, 0,
                                            mbedtls_ctr_drbg_random, &mCtrDrbg))
        {
            ExitNow(error = ERROR_INVALID_ARGS("bad private key; {}", ErrorFromMbedtlsError(fail).GetMessage()));
        }

        mCipherSuites.push_back(MBEDTLS_TLS_ECDHE_ECDSA_WITH_AES_128_CCM_8);

        mbedtls_ssl_conf_ca_chain(&mConfig, &mCaChain, nullptr);
        if (int fail = mbedtls_ssl_conf_own_cert(&mConfig, &mOwnCert, &mOwnKey))
        {
            ExitNow(error = ErrorFromMbedtlsError(fail));
        }
    }

    mCipherSuites.push_back(0);
    mbedtls_ssl_conf_ciphersuites(&mConfig, &mCipherSuites[0]);

    mbedtls_ssl_set_export_keys_cb(&mSsl, HandleMbedtlsExportKeys, this);
    mbedtls_ssl_conf_rng(&mConfig, mbedtls_ctr_drbg_random, &mCtrDrbg);

    // Cookie
    if (mIsServer)
    {
        if (int fail = mbedtls_ssl_cookie_setup(&mCookie, mbedtls_ctr_drbg_random, &mCtrDrbg))
        {
            ExitNow(error = ErrorFromMbedtlsError(fail));
        }
        mbedtls_ssl_conf_dtls_cookies(&mConfig, mbedtls_ssl_cookie_write, mbedtls_ssl_cookie_check, &mCookie);
    }

    // bio
    // mbedtls_ssl_set_bio(&mSsl, &mNetCtx, mbedtls_net_send, mbedtls_net_recv, nullptr);
    mbedtls_ssl_set_bio(&mSsl, mSocket.get(), Socket::Send, Socket::Receive, nullptr);

    // Timer
    mbedtls_ssl_set_timer_cb(&mSsl, &mHandshakeTimer, DtlsTimer::SetDelay, DtlsTimer::GetDelay);

    if (int fail = mbedtls_ssl_conf_max_frag_len(&mConfig, KMaxFragmentLengthCode))
    {
        ExitNow(error = ErrorFromMbedtlsError(fail));
    }

    // MTU
    mbedtls_ssl_set_mtu(&mSsl, kMaxTransmissionUnit);

    // Setup
    if (int fail = mbedtls_ssl_setup(&mSsl, &mConfig))
    {
        ExitNow(error = ErrorFromMbedtlsError(fail));
    }

    // Set EC-JPAKE password after initializing the SSL object.
    if (!aConfig.mPSK.empty())
    {
        if (int fail = mbedtls_ssl_set_hs_ecjpake_password(&mSsl, aConfig.mPSK.data(), aConfig.mPSK.size()))
        {
            ExitNow(error =
                        ERROR_SECURITY("set DTLS pre-shared key failed; {}", ErrorFromMbedtlsError(fail).GetMessage()));
        }
    }

exit:
    return error;
}